

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

Node * __thiscall ExprEval::Tokenizer::get(Node *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  pointer pcVar2;
  pointer pNVar3;
  pointer pNVar4;
  ulong uVar5;
  int iVar6;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *this_00;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this_01;
  const_reference pvVar7;
  const_reference pvVar8;
  Exception *this_02;
  size_type __n;
  size_t i;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  ulong local_168;
  string local_148 [32];
  string local_128 [32];
  string number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50 [4];
  
  (__return_storage_ptr__->symbol)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->symbol).field_2;
  (__return_storage_ptr__->symbol)._M_string_length = 0;
  (__return_storage_ptr__->symbol).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->expression)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->expression).field_2;
  (__return_storage_ptr__->expression)._M_string_length = 0;
  (__return_storage_ptr__->expression).field_2._M_local_buf[0] = '\0';
  this_00 = Operator::get_spec_table();
  this_01 = Operator::get_custom_table();
  pcVar2 = (this->m_expression)._M_dataplus._M_p;
  uVar11 = (this->m_expression)._M_string_length;
  sVar9 = this->m_index;
  pNVar3 = (this->m_cache).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar4 = (this->m_cache).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (uVar11 <= sVar9 && pNVar3 == pNVar4) {
      __return_storage_ptr__->type = Empty;
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar9];
    if (cVar1 != ' ') break;
    sVar9 = sVar9 + 1;
    this->m_index = sVar9;
  }
  if (pNVar3 == pNVar4) {
    if (cVar1 != '(') {
      if ((byte)(cVar1 - 0x30U) < 10) {
        number._M_dataplus._M_p = (pointer)&number.field_2;
        number._M_string_length = 0;
        number.field_2._M_local_buf[0] = '\0';
        while ((sVar9 < uVar11 &&
               (cVar1 = (this->m_expression)._M_dataplus._M_p[sVar9],
               cVar1 == '.' || (byte)(cVar1 - 0x30U) < 10))) {
          std::__cxx11::string::push_back((char)&number);
          uVar11 = (this->m_expression)._M_string_length;
          sVar9 = this->m_index + 1;
          this->m_index = sVar9;
        }
        std::__cxx11::string::substr((ulong)local_50,(ulong)this);
        dVar12 = strtod(local_50[0],(char **)0x0);
        __return_storage_ptr__->type = Number;
        __return_storage_ptr__->number = dVar12;
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)&number);
        return __return_storage_ptr__;
      }
      uVar11 = 0;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)(this_00->
                                 super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 7);
          uVar10 = uVar10 + 1) {
        pvVar7 = std::
                 vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                 ::at(this_00,uVar10);
        uVar5 = (pvVar7->symbol)._M_string_length;
        if (this->m_index + uVar5 <= (this->m_expression)._M_string_length) {
          pvVar7 = std::
                   vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                   ::at(this_00,uVar10);
          std::__cxx11::string::substr((ulong)&number,(ulong)this);
          iVar6 = std::__cxx11::string::compare((string *)&pvVar7->symbol);
          std::__cxx11::string::~string((string *)&number);
          if (iVar6 == 0 && uVar11 < uVar5) {
            uVar11 = uVar5;
            local_168 = uVar10;
          }
        }
      }
      if (uVar11 != 0) {
        this->m_index = (this->m_index + uVar11) - 1;
        pvVar7 = std::
                 vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                 ::at(this_00,local_168);
        std::__cxx11::string::string(local_148,(string *)&pvVar7->symbol);
        __return_storage_ptr__->type = Operator;
        std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->symbol);
        std::__cxx11::string::~string(local_148);
        this->m_index = this->m_index + 1;
        return __return_storage_ptr__;
      }
      local_168 = 0;
      __n = 0;
      for (uVar11 = 0;
          uVar11 < (ulong)(((long)(this_01->
                                  super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0x98);
          uVar11 = uVar11 + 1) {
        pvVar8 = std::
                 vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                 ::at(this_01,uVar11);
        uVar10 = (pvVar8->symbol)._M_string_length;
        if (this->m_index + uVar10 <= (this->m_expression)._M_string_length) {
          pvVar8 = std::
                   vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                   ::at(this_01,uVar11);
          std::__cxx11::string::substr((ulong)&number,(ulong)this);
          iVar6 = std::__cxx11::string::compare((string *)&pvVar8->symbol);
          std::__cxx11::string::~string((string *)&number);
          if (iVar6 == 0 && local_168 < uVar10) {
            __n = uVar11;
            local_168 = uVar10;
          }
        }
      }
      if (local_168 != 0) {
        pvVar8 = std::
                 vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                 ::at(this_01,__n);
        Operator::CustomOperator::CustomOperator((CustomOperator *)&number,pvVar8);
        sVar9 = this->m_index;
        std::__cxx11::string::substr((ulong)local_128,(ulong)this);
        __return_storage_ptr__->type = Operator;
        std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->symbol);
        std::__cxx11::string::~string(local_128);
        this->m_index =
             CONCAT71(number.field_2._M_allocated_capacity._1_7_,number.field_2._M_local_buf[0]) +
             sVar9;
        Operator::CustomOperator::~CustomOperator((CustomOperator *)&number);
        return __return_storage_ptr__;
      }
      this_02 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string(&number,this->m_index);
      std::operator+(&local_70,"node @ ",&number);
      Engine::Exception::Exception(this_02,Symbol_Not_Found,&local_70);
      __cxa_throw(this_02,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
    }
    tokenize(this);
    Engine::Node::operator=
              (__return_storage_ptr__,
               (this->m_cache).
               super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  else {
    Engine::Node::operator=(__return_storage_ptr__,pNVar4 + -1);
  }
  std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::pop_back
            (&this->m_cache);
  return __return_storage_ptr__;
}

Assistant:

Node Tokenizer::get(){
        Node node;
        auto m_table = Operator::get_spec_table();
        auto custom_table = Operator::get_custom_table();
        // std::cout<<" >> current index: "<<m_index<<'\n';
        while(m_index < m_expression.size() || !m_cache.empty()){
            if(m_expression[m_index] == ' '){
                ++m_index;
                continue;
            }
            while(!m_cache.empty()){
                node = m_cache.back();
                m_cache.pop_back();
                return node;
            }

            if(m_expression[m_index] == '('){
                try
                {
                    tokenize();
                    node = m_cache.back();
                    m_cache.pop_back();
                }
                catch(const Engine::Exception& e)
                {
                    throw e;
                }
                return node;
            }
            else if(is_digit(m_expression[m_index])){
                std::string number;
                size_t beg = m_index;
                while(m_index < m_expression.size() && (is_digit(m_expression[m_index]) || m_expression[m_index] == '.')){
                    number.push_back(m_expression[m_index]);
                    ++m_index;
                }
                node.set(strtod(m_expression.substr(beg, m_index-beg).c_str(), nullptr));
                return node;
            }
            
            size_t opr_index, opr_length = 0;
            for (size_t i=0; i<m_table->size(); ++i){
                size_t length = m_table->at(i).symbol.size();
                if(m_index + length > m_expression.size()) continue;
                if(m_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                    if(opr_length < length){
                        opr_length = length;
                        opr_index = i;
                    }
                }
            }

            if(!opr_length){
                // std::cout<<"searching for user-defined symbols...\n";
                size_t custom_opr_index, custom_opr_length = 0;
                for(size_t i=0; i<custom_table->size(); ++i){
                    size_t length = custom_table->at(i).symbol.size();
                    if(m_index + length > m_expression.size()) continue;
                    if(custom_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                        if(custom_opr_length < length){
                            custom_opr_length = length;
                            custom_opr_index = i;
                        }
                    }
                }
                if(custom_opr_length){
                    // std::cout<<"custom operator index: "<<custom_opr_index<<'\n';
                    auto custom_operator = custom_table->at(custom_opr_index);
                    // std::cout<<"custom operator: "<<custom_operator.symbol<<'\n';
                    size_t new_index = m_index+custom_operator.symbol.size();
                    // std::cout<<"parsed symbol: "<<m_expression.substr(m_index, new_index-m_index)<<'\n';
                    node.set(m_expression.substr(m_index, new_index-m_index), false);
                    m_index = new_index;

                    return node;
                }
                else{
                    throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(m_index));
                }
            }
            else{
                m_index += opr_length - 1;

                node.set(m_table->at(opr_index).symbol, false);
                ++m_index;
                return node;
            }
        }

        node.type = NodeType::Empty;
        return node;
    }